

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary_matrix.h
# Opt level: O0

Index __thiscall
Gudhi::persistence_matrix::
Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>>
::insert_boundary<std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>>
           *this,ID_index cellIndex,vector<unsigned_int,_std::allocator<unsigned_int>_> *boundary,
          Dimension dim)

{
  Index IVar1;
  int iVar2;
  size_type sVar3;
  int local_38;
  Dimension local_24;
  Dimension dim_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *boundary_local;
  ID_index cellIndex_local;
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>
  *this_local;
  
  iVar2 = Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
          ::get_null_value<int>();
  local_24 = dim;
  if (dim == iVar2) {
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(boundary);
    if (sVar3 == 0) {
      local_38 = 0;
    }
    else {
      sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(boundary);
      local_38 = (int)sVar3 + -1;
    }
    local_24 = local_38;
  }
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>
  ::_orderRowsIfNecessary
            ((Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>
              *)this);
  _container_insert<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            (this,boundary,*(Index *)(this + 0x18),local_24);
  IVar1 = *(Index *)(this + 0x18);
  *(Index *)(this + 0x18) = IVar1 + 1;
  return IVar1;
}

Assistant:

inline typename Boundary_matrix<Master_matrix>::Index Boundary_matrix<Master_matrix>::insert_boundary(
    ID_index cellIndex, const Boundary_range& boundary, Dimension dim)
{
  if (dim == Master_matrix::template get_null_value<Dimension>()) dim = boundary.size() == 0 ? 0 : boundary.size() - 1;

  _orderRowsIfNecessary();

  //updates container sizes
  if constexpr (Master_matrix::Option_list::has_row_access && !Master_matrix::Option_list::has_removable_rows) {
    if (boundary.size() != 0){
      ID_index pivot;
      if constexpr (Master_matrix::Option_list::is_z2) {
        pivot = *std::prev(boundary.end());
      } else {
        pivot = std::prev(boundary.end())->first;
      }
      //row container
      if (RA_opt::rows_->size() <= pivot) RA_opt::rows_->resize(pivot + 1);
    }
  }

  //row swap map containers
  if constexpr (Master_matrix::Option_list::has_map_column_container) {
    if constexpr (activeSwapOption) {
      Swap_opt::indexToRow_.emplace(cellIndex, cellIndex);
      Swap_opt::rowToIndex_.emplace(cellIndex, cellIndex);
    }
  } else {
    if constexpr (activeSwapOption) {
      for (Index i = Swap_opt::indexToRow_.size(); i <= cellIndex; ++i) {
        Swap_opt::indexToRow_.push_back(i);
        Swap_opt::rowToIndex_.push_back(i);
      }
    }
  }

  //maps for possible shifting between column content and position indices used for birth events
  if constexpr (activePairingOption){
    if (cellIndex != nextInsertIndex_){
      Pair_opt::idToPosition_.emplace(cellIndex, nextInsertIndex_);
      if constexpr (Master_matrix::Option_list::has_removable_columns){
        Pair_opt::PIDM::map_.emplace(nextInsertIndex_, cellIndex);
      }
    }
  }

  _container_insert(boundary, nextInsertIndex_, dim);

  return nextInsertIndex_++;
}